

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  ostream *poVar1;
  ColourGuard local_28;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  Catch::operator<<(poVar1,(lineOfChars)0x7e);
  poVar1 = std::operator<<(poVar1,'\n');
  local_28.m_colourImpl =
       Detail::unique_ptr<Catch::ColourImpl>::operator->
                 (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  local_28.m_code = FileName;
  local_28.m_engaged = false;
  ColourImpl::ColourGuard::engageImpl(&local_28,poVar1);
  poVar1 = (ostream *)
           std::ostream::write((char *)poVar1,
                               (long)(this->super_StreamingReporterBase).currentTestRunInfo.name.
                                     m_start);
  poVar1 = std::operator<<(poVar1," is a Catch2 v");
  libraryVersion();
  Catch::operator<<(poVar1,&libraryVersion::version);
  poVar1 = std::operator<<(poVar1," host application.\n");
  std::operator<<(poVar1,"Run with -? for options\n\n");
  ColourImpl::ColourGuard::~ColourGuard(&local_28);
  this->m_testRunInfoPrinted = true;
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    m_stream << '\n'
             << lineOfChars( '~' ) << '\n'
             << m_colour->guardColour( Colour::SecondaryText )
             << currentTestRunInfo.name << " is a Catch2 v" << libraryVersion()
             << " host application.\n"
             << "Run with -? for options\n\n";

    m_testRunInfoPrinted = true;
}